

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  bool bVar1;
  byte bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_00;
  const_reference ppcVar3;
  char *name_00;
  ostream *poVar4;
  string local_340;
  undefined4 local_31c;
  undefined1 local_318 [8];
  cmGeneratedFileStream fout;
  string filename;
  allocator local_79;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string name;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  if (!bVar1) {
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0x9d,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
  this_00 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_00,0);
  name.field_2._8_8_ = *ppcVar3;
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_58,(cmLocalGenerator *)name.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"Source",&local_79);
  GetPathBasename((string *)((long)&filename.field_2 + 8),&this->HomeDirectory);
  GenerateProjectName((string *)local_38,&local_58,&local_78,(string *)((long)&filename.field_2 + 8)
                     );
  std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeDirectory,"/.project");
  name_00 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_318,name_00,false);
  bVar2 = std::ios::operator!((ios *)(local_318 + (long)*(_func_int **)((long)local_318 + -0x18)));
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)local_318,
                             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<projectDescription>\n\t<name>"
                            );
    EscapeForXML(&local_340,(string *)local_38);
    poVar4 = std::operator<<(poVar4,(string *)&local_340);
    std::operator<<(poVar4,
                    "</name>\n\t<comment></comment>\n\t<projects>\n\t</projects>\n\t<buildSpec>\n\t</buildSpec>\n\t<natures>\n\t</natures>\n\t<linkedResources>\n"
                   );
    std::__cxx11::string::~string((string *)&local_340);
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmGeneratedFileStream *)local_318,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->SrcLinkedResources);
    }
    std::operator<<((ostream *)local_318,"\t</linkedResources>\n</projectDescription>\n");
    local_31c = 0;
  }
  else {
    local_31c = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_318);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = this->GenerateProjectName(lg->GetProjectName(), "Source",
                                   this->GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout <<
    "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
    "<projectDescription>\n"
    "\t<name>" << this->EscapeForXML(name) << "</name>\n"
    "\t<comment></comment>\n"
    "\t<projects>\n"
    "\t</projects>\n"
    "\t<buildSpec>\n"
    "\t</buildSpec>\n"
    "\t<natures>\n"
    "\t</natures>\n"
    "\t<linkedResources>\n";

  if (this->SupportsVirtualFolders)
    {
    this->CreateLinksToSubprojects(fout, this->HomeDirectory);
    this->SrcLinkedResources.clear();
    }

  fout <<
    "\t</linkedResources>\n"
    "</projectDescription>\n"
    ;
}